

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_compile.cpp
# Opt level: O0

ZCC_Expression * __thiscall
ZCCCompiler::SimplifyFunctionCall(ZCCCompiler *this,ZCC_ExprFuncCall *callop)

{
  int routelen_00;
  ZCC_Expression *pZVar1;
  ZCC_Expression *val;
  int routelen;
  Conversion *route [8];
  PType *dest;
  ZCC_FuncParm *pZStack_28;
  int parmcount;
  ZCC_FuncParm *parm;
  ZCC_ExprFuncCall *callop_local;
  ZCCCompiler *this_local;
  
  dest._4_4_ = 0;
  pZVar1 = Simplify(this,callop->Function);
  callop->Function = pZVar1;
  pZStack_28 = callop->Parameters;
  if (pZStack_28 != (ZCC_FuncParm *)0x0) {
    do {
      dest._4_4_ = dest._4_4_ + 1;
      if ((pZStack_28->super_ZCC_TreeNode).NodeType != AST_FuncParm) {
        __assert_fail("parm->NodeType == AST_FuncParm",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/zcc_compile.cpp"
                      ,0x16f,"ZCC_Expression *ZCCCompiler::SimplifyFunctionCall(ZCC_ExprFuncCall *)"
                     );
      }
      pZVar1 = Simplify(this,pZStack_28->Value);
      pZStack_28->Value = pZVar1;
      pZStack_28 = (ZCC_FuncParm *)(pZStack_28->super_ZCC_TreeNode).SiblingNext;
    } while (pZStack_28 != callop->Parameters);
  }
  this_local = (ZCCCompiler *)callop;
  if (callop->Function->Operation == PEX_TypeRef) {
    if (dest._4_4_ == 1) {
      route[7] = (Conversion *)callop->Function[1].super_ZCC_TreeNode.SiblingNext;
      routelen_00 = PType::FindConversion
                              (pZStack_28->Value->Type,(PType *)route[7],
                               (Conversion **)&stack0xffffffffffffff88,8);
      if (routelen_00 < 0) {
        Error(this,(ZCC_TreeNode *)callop,"Cannot convert type 1 to type 2");
        ZCC_Expression::ToErrorNode(&callop->super_ZCC_Expression);
      }
      else {
        this_local = (ZCCCompiler *)
                     ApplyConversion(this,pZStack_28->Value,(Conversion **)&stack0xffffffffffffff88,
                                     routelen_00);
        if (*(PType **)&(this_local->Classes).Most != (PType *)route[7]) {
          __assert_fail("val->Type == dest",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/zcc_compile.cpp"
                        ,0x18c,
                        "ZCC_Expression *ZCCCompiler::SimplifyFunctionCall(ZCC_ExprFuncCall *)");
        }
      }
    }
    else {
      Error(this,(ZCC_TreeNode *)callop,"Type cast requires one parameter");
      ZCC_Expression::ToErrorNode(&callop->super_ZCC_Expression);
    }
  }
  return (ZCC_Expression *)this_local;
}

Assistant:

ZCC_Expression *ZCCCompiler::SimplifyFunctionCall(ZCC_ExprFuncCall *callop)
{
	ZCC_FuncParm *parm;
	int parmcount = 0;

	callop->Function = Simplify(callop->Function);
	parm = callop->Parameters;
	if (parm != NULL)
	{
		do
		{
			parmcount++;
			assert(parm->NodeType == AST_FuncParm);
			parm->Value = Simplify(parm->Value);
			parm = static_cast<ZCC_FuncParm *>(parm->SiblingNext);
		}
		while (parm != callop->Parameters);
	}
	// If the left side is a type ref, then this is actually a cast
	// and not a function call.
	if (callop->Function->Operation == PEX_TypeRef)
	{
		if (parmcount != 1)
		{
			Error(callop, "Type cast requires one parameter");
			callop->ToErrorNode();
		}
		else
		{
			PType *dest = static_cast<ZCC_ExprTypeRef *>(callop->Function)->RefType;
			const PType::Conversion *route[CONVERSION_ROUTE_SIZE];
			int routelen = parm->Value->Type->FindConversion(dest, route, countof(route));
			if (routelen < 0)
			{
				///FIXME: Need real type names
				Error(callop, "Cannot convert type 1 to type 2");
				callop->ToErrorNode();
			}
			else
			{
				ZCC_Expression *val = ApplyConversion(parm->Value, route, routelen);
				assert(val->Type == dest);
				return val;
			}
		}
	}
	return callop;
}